

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddP70color(Node *this,string *name,double r,double g,double b)

{
  Node n;
  allocator local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  Node local_80;
  
  local_d8 = r;
  local_d0 = g;
  local_c8 = b;
  std::__cxx11::string::string((string *)&local_a0,"P",&local_d9);
  Node(&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double,double,double>
            (&local_80,&local_c0,"ColorRGB","Color","",local_d8,local_d0,local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_80);
  ~Node(&local_80);
  return;
}

Assistant:

void FBX::Node::AddP70color(
    const std::string& name, double r, double g, double b
) {
    FBX::Node n("P");
    n.AddProperties(name, "ColorRGB", "Color", "", r, g, b);
    AddChild(n);
}